

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gcpio_compat.c
# Opt level: O1

void unpack_test(char *from,char *options,char *se)

{
  wchar_t wVar1;
  
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
                     ,L'\x0f',from,L'ǽ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
                  ,L'\x10',from);
  extract_reference_file(from);
  wVar1 = systemf("%s -i %s < %s >unpack.out 2>unpack.err",testprog,"--no-preserve-owner",from);
  failure("Error invoking %s -i %s < %s",testprog,"--no-preserve-owner",from);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
                      ,L'\x1a',(long)wVar1,"r",0,"0",(void *)0x0);
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    failure("Error invoking %s -i %s < %s",testprog,"--no-preserve-owner",from);
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
               ,L' ',options,"unpack.err");
  }
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
                   ,L'(',"file",L'Ƥ');
  failure("%s",from);
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
                      ,L'*',"file",10);
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
                      ,L'+',"linkfile",10);
  failure("%s",from);
  assertion_file_nlinks
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
             ,L'-',"file",L'\x02');
  failure("%s",from);
  assertion_is_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
             ,L'1',"linkfile","file");
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
                      ,L'2',"file",10);
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
                      ,L'3',"linkfile",10);
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
               ,L'7',"symlink","file",L'\0');
  }
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
                   ,L':',"dir",L'ǽ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
                  ,L'<',"..");
  return;
}

Assistant:

static void
unpack_test(const char *from, const char *options, const char *se)
{
	int r;

	/* Create a work dir named after the file we're unpacking. */
	assertMakeDir(from, 0775);
	assertChdir(from);

	/*
	 * Use cpio to unpack the sample archive
	 */
	extract_reference_file(from);
	r = systemf("%s -i %s < %s >unpack.out 2>unpack.err",
	    testprog, options, from);
	failure("Error invoking %s -i %s < %s",
	    testprog, options, from);
	assertEqualInt(r, 0);

	/* Verify that nothing went to stderr. */
	if (canSymlink()) {
		failure("Error invoking %s -i %s < %s",
		    testprog, options, from);
		assertTextFileContents(se, "unpack.err");
	}

	/*
	 * Verify unpacked files.
	 */

	/* Regular file with 2 links. */
	assertIsReg("file", 0644);
	failure("%s", from);
	assertFileSize("file", 10);
	assertFileSize("linkfile", 10);
	failure("%s", from);
	assertFileNLinks("file", 2);

	/* Another name for the same file. */
	failure("%s", from);
	assertIsHardlink("linkfile", "file");
	assertFileSize("file", 10);
	assertFileSize("linkfile", 10);

	/* Symlink */
	if (canSymlink())
		assertIsSymlink("symlink", "file", 0);

	/* dir */
	assertIsDir("dir", 0775);

	assertChdir("..");
}